

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O0

void c219_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  int local_58;
  int local_54;
  INT32 s;
  INT32 newofs;
  UINT32 frequency;
  C219_VREGS *vreg;
  C219_VOICE *v;
  DEV_SMPL out [2];
  UINT32 j;
  UINT32 i;
  c219_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  if (*(long *)((long)param + 0x18) != 0) {
    for (out[1] = 0; (uint)out[1] < samples; out[1] = out[1] + 1) {
      v._4_4_ = 0;
      v._0_4_ = 0;
      for (out[0] = 0; (uint)out[0] < 0x10; out[0] = out[0] + 1) {
        lVar3 = (ulong)(uint)out[0] * 0x1c;
        pbVar2 = (byte *)((long)param + (ulong)(uint)(out[0] << 4) + 0x20);
        if ((*(char *)((long)param + lVar3 + 0x43c) != '\0') &&
           (*(char *)((long)param + lVar3 + 0x43d) == '\0')) {
          uVar1 = (uint)*(ushort *)((long)param + lVar3 + 0x428) +
                  (uint)CONCAT11(pbVar2[2],pbVar2[3]);
          *(short *)((long)param + lVar3 + 0x428) = (short)uVar1;
          if ((uVar1 & 0x10000) != 0) {
            c219_fetch_sample((c219_state *)param,out[0]);
          }
          local_54 = (int)*(short *)((long)param + lVar3 + 0x42c) +
                     (int)((ulong)*(ushort *)((long)param + lVar3 + 0x428) *
                           (long)((int)*(short *)((long)param + lVar3 + 0x42a) -
                                 (int)*(short *)((long)param + lVar3 + 0x42c)) >> 0x10);
          if ((pbVar2[5] & 0x40) != 0) {
            local_54 = -local_54;
          }
          if ((pbVar2[5] & 0x40) == 0) {
            local_58 = local_54;
          }
          else {
            local_58 = -local_54;
          }
          v._0_4_ = local_58 * (uint)pbVar2[1] + (int)v;
          v._4_4_ = local_54 * (uint)*pbVar2 + v._4_4_;
        }
      }
      (*outputs)[(uint)out[1]] = ((int)v >> 9) + (*outputs)[(uint)out[1]];
      outputs[1][(uint)out[1]] = (v._4_4_ >> 9) + outputs[1][(uint)out[1]];
    }
  }
  return;
}

Assistant:

static void c219_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c219_state *chip = (c219_state *)param;
	UINT32 i, j;

	DEV_SMPL out[2];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->pRom == NULL)
		return;

	for (i = 0; i < samples; i ++)
	{
		out[0] = out[1] = 0;

		for (j = 0; j < MAX_VOICE; j ++)
		{
			C219_VOICE* v = &chip->voi[j];
			const C219_VREGS* vreg = (C219_VREGS*)&chip->REG[j*16];

			if (v->key && ! v->Muted)
			{
				UINT32 frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;
				INT32 newofs;
				INT32 s;

				newofs = v->pofs + frequency;
				v->pofs = newofs & 0xFFFF;
				if (newofs & 0x10000)
					c219_fetch_sample(chip, j);

				// Interpolate samples
				s = v->last_sample + (INT32)((INT64)v->pofs * (v->sample - v->last_sample) >> 16);

				if (vreg->mode & C219_MODE_INVERT)
					s = -s;
				out[0] += (((vreg->mode & C219_MODE_INVERT) ? -s : s) * vreg->volume_left);
				out[1] += (s * vreg->volume_right);
			}
		}

		outputs[0][i] += (out[0] >> 9);
		outputs[1][i] += (out[1] >> 9);
	}
}